

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O2

bool __thiscall Regex::processTerminal(Regex *this,Element *cur_node,ParseData *data)

{
  char cVar1;
  Element *pEVar2;
  char cVar3;
  Element **ppEVar4;
  
  if (cur_node->mType == TYPE_CLASS) {
    cVar3 = cur_node->mClassInvert;
    ppEVar4 = &cur_node->mChild;
    while (pEVar2 = *ppEVar4, pEVar2 != (Element *)0x0) {
      cVar1 = (data->string)._M_dataplus._M_p[data->cur_pos];
      if ((bool)cVar3 == false) {
        if ((pEVar2->mTermStartChar <= cVar1) && (cVar1 <= pEVar2->mTermEndChar)) {
          return true;
        }
      }
      else if ((pEVar2->mTermStartChar <= cVar1) && (cVar1 <= pEVar2->mTermEndChar))
      goto LAB_0011d5c1;
      ppEVar4 = &pEVar2->mNext;
    }
  }
  else if (((cur_node->mType != TYPE_TERMINAL) ||
           (cVar1 = (data->string)._M_dataplus._M_p[data->cur_pos], cVar1 < cur_node->mTermStartChar
           )) || (cVar3 = '\x01', cur_node->mTermEndChar < cVar1)) {
LAB_0011d5c1:
    cVar3 = '\0';
  }
  return (bool)cVar3;
}

Assistant:

bool	Regex::processTerminal( Element *cur_node, ParseData *data )
{
	if ( cur_node->mType == TYPE_TERMINAL )
	{
		if ( CUR_CHAR >= cur_node->mTermStartChar && CUR_CHAR <= cur_node->mTermEndChar )
			return true;
	}
	else if ( cur_node->mType == TYPE_CLASS )
	{
		bool invert = cur_node->mClassInvert;
		bool match = invert;
		Element *child_node = cur_node->mChild;
		
		while ( child_node != NULL )
		{
			if ( !invert )
			{
				if ( CUR_CHAR >= child_node->mTermStartChar && CUR_CHAR <= child_node->mTermEndChar )
					return true;
			}
			else
			{
				if ( CUR_CHAR >= child_node->mTermStartChar && CUR_CHAR <= child_node->mTermEndChar )
					return false;
			}
			
			child_node = child_node->mNext;
		}
		
		if ( match )
			return true;
		else
			return false;
	}

	return false;
}